

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigApi.c
# Opt level: O2

Fraig_Node_t * Fraig_ManReadIthVar(Fraig_Man_t *p,int i)

{
  Fraig_Node_t *pFVar1;
  Fraig_NodeVec_t *pFVar2;
  int iVar3;
  
  if (i < 0) {
    puts("Requesting a PI with a negative number");
    pFVar1 = (Fraig_Node_t *)0x0;
  }
  else {
    pFVar2 = p->vInputs;
    iVar3 = pFVar2->nSize;
    if (iVar3 <= i) {
      for (; iVar3 <= i; iVar3 = iVar3 + 1) {
        Fraig_NodeCreatePi(p);
      }
      pFVar2 = p->vInputs;
    }
    pFVar1 = pFVar2->pArray[(uint)i];
  }
  return pFVar1;
}

Assistant:

Fraig_Node_t * Fraig_ManReadIthVar( Fraig_Man_t * p, int i )
{
    int k;
    if ( i < 0 )
    {
        printf( "Requesting a PI with a negative number\n" );
        return NULL;
    }
    // create the PIs to fill in the interval
    if ( i >= p->vInputs->nSize )
        for ( k = p->vInputs->nSize; k <= i; k++ )
            Fraig_NodeCreatePi( p ); 
    return p->vInputs->pArray[i];
}